

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O2

simdjson_result<double> __thiscall simdjson::dom::element::get_double(element *this)

{
  undefined8 uVar1;
  size_t sVar2;
  tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_> tVar3;
  long lVar4;
  double dVar5;
  simdjson_result<double> sVar6;
  
  sVar2 = (this->tape).json_index;
  tVar3.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (((this->tape).doc)->tape)._M_t.
       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>;
  lVar4 = *(long *)((long)tVar3.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + sVar2 * 8);
  if (lVar4 == 0x6400000000000000) {
    dVar5 = *(double *)
             ((long)tVar3.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + 8 + sVar2 * 8);
  }
  else if (lVar4 == 0x7500000000000000) {
    uVar1 = *(undefined8 *)
             ((long)tVar3.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + 8 + sVar2 * 8);
    dVar5 = ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  }
  else {
    if (lVar4 != 0x6c00000000000000) {
      return (simdjson_result_base<double>)(ZEXT816(0x10) << 0x40);
    }
    dVar5 = (double)*(long *)((long)tVar3.
                                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                    .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + 8
                             + sVar2 * 8);
  }
  sVar6.super_simdjson_result_base<double>.super_pair<double,_simdjson::error_code>._8_8_ = 0;
  sVar6.super_simdjson_result_base<double>.super_pair<double,_simdjson::error_code>.first = dVar5;
  return (simdjson_result<double>)
         sVar6.super_simdjson_result_base<double>.super_pair<double,_simdjson::error_code>;
}

Assistant:

simdjson_really_inline bool tape_ref::is_double() const noexcept {
  constexpr uint64_t tape_double = uint64_t(tape_type::DOUBLE)<<56;
  return doc->tape[json_index] == tape_double;
}